

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_base64_output rf_decode_base64(uchar *input,rf_allocator allocator)

{
  byte bVar1;
  byte bVar2;
  rf_source_location rVar3;
  undefined1 auVar4 [24];
  byte bVar5;
  uchar *puVar6;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  long lVar10;
  rf_base64_output rVar11;
  uint uStack_5c;
  rf_allocator local_40;
  
  local_40.user_data = allocator.user_data;
  local_40.allocator_proc = allocator.allocator_proc;
  rVar11.size = rf_get_size_base64(input);
  lVar10 = (long)(int)rVar11.size;
  rVar3.proc_name = "rf_decode_base64";
  rVar3.file_name =
       "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  rVar3.line_in_file = 0x76f;
  auVar4._8_8_ = (ulong)uStack_5c << 0x20;
  auVar4._0_8_ = lVar10;
  auVar4._16_8_ = 0;
  puVar6 = (uchar *)(*allocator.allocator_proc)
                              (&local_40,rVar3,RF_AM_ALLOC,(rf_allocator_args)(auVar4 << 0x40));
  lVar7 = (long)((int)rVar11.size / 3);
  if (2 < (int)rVar11.size) {
    pbVar8 = puVar6 + 2;
    lVar9 = 0;
    do {
      bVar5 = ""[input[lVar9 * 4 + 1]];
      bVar1 = ""[input[lVar9 * 4 + 2]];
      bVar2 = input[lVar9 * 4 + 3];
      pbVar8[-2] = bVar5 >> 4 | ""[input[lVar9 * 4]] << 2;
      pbVar8[-1] = bVar1 >> 2 | bVar5 << 4;
      *pbVar8 = bVar1 << 6 | ""[bVar2];
      lVar9 = lVar9 + 1;
      pbVar8 = pbVar8 + 3;
    } while (lVar7 != lVar9);
  }
  if ((int)rVar11.size % 3 == 1) {
    bVar5 = ""[input[(long)(int)(lVar7 << 2) + 1]] >> 4 | ""[input[lVar7 * 4]] << 2;
  }
  else {
    if ((int)rVar11.size % 3 != 2) goto LAB_001208a8;
    lVar9 = (long)(int)(lVar7 << 2);
    bVar5 = ""[input[lVar9 + 1]];
    bVar1 = ""[input[lVar9 + 2]];
    puVar6[lVar10 + -2] = bVar5 >> 4 | ""[input[lVar7 * 4]] << 2;
    bVar5 = bVar1 >> 2 | bVar5 << 4;
  }
  puVar6[lVar10 + -1] = bVar5;
LAB_001208a8:
  rVar11._4_4_ = 0;
  rVar11.buffer = puVar6;
  return rVar11;
}

Assistant:

RF_API rf_base64_output rf_decode_base64(const unsigned char* input, rf_allocator allocator)
{
    static const unsigned char rf_base64_table[] = {
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
        0, 0, 0, 62, 0, 0, 0, 63, 52, 53,
        54, 55, 56, 57, 58, 59, 60, 61, 0, 0,
        0, 0, 0, 0, 0, 0, 1, 2, 3, 4,
        5, 6, 7, 8, 9, 10, 11, 12, 13, 14,
        15, 16, 17, 18, 19, 20, 21, 22, 23, 24,
        25, 0, 0, 0, 0, 0, 0, 26, 27, 28,
        29, 30, 31, 32, 33, 34, 35, 36, 37, 38,
        39, 40, 41, 42, 43, 44, 45, 46, 47, 48,
        49, 50, 51
    };

    rf_base64_output result;
    result.size = rf_get_size_base64(input);
    result.buffer = RF_ALLOC(allocator, result.size);

    for (rf_int i = 0; i < result.size / 3; i++)
    {
        unsigned char a = rf_base64_table[(int) input[4 * i + 0]];
        unsigned char b = rf_base64_table[(int) input[4 * i + 1]];
        unsigned char c = rf_base64_table[(int) input[4 * i + 2]];
        unsigned char d = rf_base64_table[(int) input[4 * i + 3]];

        result.buffer[3 * i + 0] = (a << 2) | (b >> 4);
        result.buffer[3 * i + 1] = (b << 4) | (c >> 2);
        result.buffer[3 * i + 2] = (c << 6) | d;
    }

    int n = result.size / 3;

    if (result.size % 3 == 1)
    {
        unsigned char a = rf_base64_table[(int) input[4 * n + 0]];
        unsigned char b = rf_base64_table[(int) input[4 * n + 1]];

        result.buffer[result.size - 1] = (a << 2) | (b >> 4);
    } else if (result.size % 3 == 2)
    {
        unsigned char a = rf_base64_table[(int) input[4 * n + 0]];
        unsigned char b = rf_base64_table[(int) input[4 * n + 1]];
        unsigned char c = rf_base64_table[(int) input[4 * n + 2]];

        result.buffer[result.size - 2] = (a << 2) | (b >> 4);
        result.buffer[result.size - 1] = (b << 4) | (c >> 2);
    }

    return result;
}